

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O0

void __thiscall agg::bspline::prepare(bspline *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  double *pdVar6;
  double *pdVar7;
  uint uVar8;
  int iVar9;
  double dVar10;
  undefined1 local_70 [8];
  pod_array<double> al;
  double e;
  double f;
  double d;
  double p;
  double h;
  double *s;
  double *r;
  double *temp;
  uint local_18;
  int n1;
  int k;
  int i;
  bspline *this_local;
  
  if (2 < this->m_num) {
    for (local_18 = 0; (int)local_18 < this->m_num; local_18 = local_18 + 1) {
      pdVar6 = pod_array<double>::operator[](&this->m_am,local_18);
      *pdVar6 = 0.0;
    }
    uVar8 = this->m_num * 3;
    pod_array<double>::pod_array((pod_array<double> *)local_70,uVar8);
    pdVar6 = pod_array<double>::operator[]((pod_array<double> *)local_70,0);
    for (local_18 = 0; (int)local_18 < (int)uVar8; local_18 = local_18 + 1) {
      pdVar6[(int)local_18] = 0.0;
    }
    iVar3 = this->m_num;
    iVar9 = this->m_num << 1;
    iVar4 = this->m_num;
    uVar8 = iVar4 - 1;
    f = this->m_x[1] - *this->m_x;
    al._8_8_ = (this->m_y[1] - *this->m_y) / f;
    for (local_18 = 1; uVar5 = al._8_8_, (int)local_18 < (int)uVar8; local_18 = local_18 + 1) {
      dVar10 = this->m_x[(long)(int)local_18 + 1] - this->m_x[(int)local_18];
      al._8_8_ = (this->m_y[(long)(int)local_18 + 1] - this->m_y[(int)local_18]) / dVar10;
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18);
      *pdVar7 = dVar10 / (dVar10 + f);
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18);
      pdVar6[(long)iVar3 + (long)(int)local_18] = 1.0 - *pdVar7;
      pdVar6[(long)iVar9 + (long)(int)local_18] =
           (((double)al._8_8_ - (double)uVar5) * 6.0) / (f + dVar10);
      f = dVar10;
    }
    for (local_18 = 1; (int)local_18 < (int)uVar8; local_18 = local_18 + 1) {
      dVar10 = pdVar6[(long)iVar3 + (long)(int)local_18];
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18 - 1);
      dVar10 = 1.0 / (dVar10 * *pdVar7 + 2.0);
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18);
      *pdVar7 = -dVar10 * *pdVar7;
      pdVar6[(long)iVar9 + (long)(int)local_18] =
           (-pdVar6[(long)iVar3 + (long)(int)local_18] *
            pdVar6[(long)iVar9 + (long)(int)(local_18 - 1)] +
           pdVar6[(long)iVar9 + (long)(int)local_18]) * dVar10;
    }
    pdVar7 = pod_array<double>::operator[](&this->m_am,uVar8);
    *pdVar7 = 0.0;
    dVar10 = pdVar6[(long)iVar9 + (long)(int)(iVar4 - 2U)];
    pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,iVar4 - 2U);
    *pdVar7 = dVar10;
    pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,iVar4 - 2);
    dVar10 = *pdVar7;
    pdVar7 = pod_array<double>::operator[](&this->m_am,iVar4 - 2);
    *pdVar7 = dVar10;
    local_18 = iVar4 - 3;
    for (n1 = 0; n1 < this->m_num + -2; n1 = n1 + 1) {
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18);
      dVar10 = *pdVar7;
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18 + 1);
      dVar1 = *pdVar7;
      dVar2 = pdVar6[(long)iVar9 + (long)(int)local_18];
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18);
      *pdVar7 = dVar10 * dVar1 + dVar2;
      pdVar7 = pod_array<double>::operator[]((pod_array<double> *)local_70,local_18);
      dVar10 = *pdVar7;
      pdVar7 = pod_array<double>::operator[](&this->m_am,local_18);
      *pdVar7 = dVar10;
      local_18 = local_18 - 1;
    }
    pod_array<double>::~pod_array((pod_array<double> *)local_70);
  }
  this->m_last_idx = -1;
  return;
}

Assistant:

void bspline::prepare()
    {
        if(m_num > 2)
        {
            int i, k, n1;
            double* temp; 
            double* r; 
            double* s;
            double h, p, d, f, e;
    
            for(k = 0; k < m_num; k++) 
            {
                m_am[k] = 0.0;
            }

            n1 = 3 * m_num;

            pod_array<double> al(n1);
            temp = &al[0];

            for(k = 0; k < n1; k++) 
            {
                temp[k] = 0.0;
            }

            r = temp + m_num;
            s = temp + m_num * 2;

            n1 = m_num - 1;
            d = m_x[1] - m_x[0];
            e = (m_y[1] - m_y[0]) / d;

            for(k = 1; k < n1; k++) 
            {
                h     = d;
                d     = m_x[k + 1] - m_x[k];
                f     = e;
                e     = (m_y[k + 1] - m_y[k]) / d;
                al[k] = d / (d + h);
                r[k]  = 1.0 - al[k];
                s[k]  = 6.0 * (e - f) / (h + d);
            }

            for(k = 1; k < n1; k++) 
            {
                p = 1.0 / (r[k] * al[k - 1] + 2.0);
                al[k] *= -p;
                s[k] = (s[k] - r[k] * s[k - 1]) * p; 
            }

            m_am[n1]     = 0.0;
            al[n1 - 1]   = s[n1 - 1];
            m_am[n1 - 1] = al[n1 - 1];

            for(k = n1 - 2, i = 0; i < m_num - 2; i++, k--) 
            {
                al[k]   = al[k] * al[k + 1] + s[k];
                m_am[k] = al[k];
            }
        }
        m_last_idx = -1;
    }